

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

bool __thiscall wasm::BranchUtils::hasBranchTarget(BranchUtils *this,Expression *ast,Name target)

{
  bool bVar1;
  undefined1 local_118 [8];
  Scanner scanner;
  Expression *ast_local;
  Name target_local;
  
  target_local.super_IString.str._M_len = target.super_IString.str._M_len;
  scanner._232_8_ = this;
  ast_local = ast;
  bVar1 = IString::is((IString *)&ast_local);
  if (bVar1) {
    hasBranchTarget::Scanner::Scanner((Scanner *)local_118);
    wasm::Name::operator=
              ((Name *)&scanner.
                        super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                        super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                        currModule,(Name *)&ast_local);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)local_118,
               (Expression **)&scanner.has);
    target_local.super_IString.str._M_str._7_1_ = (byte)scanner.target.super_IString.str._M_str & 1;
    hasBranchTarget::Scanner::~Scanner((Scanner *)local_118);
  }
  else {
    target_local.super_IString.str._M_str._7_1_ = 0;
  }
  return (bool)(target_local.super_IString.str._M_str._7_1_ & 1);
}

Assistant:

inline bool hasBranchTarget(Expression* ast, Name target) {
  if (!target.is()) {
    return false;
  }

  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    Name target;
    bool has = false;

    void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name == target) {
          has = true;
        }
      });
    }
  };
  Scanner scanner;
  scanner.target = target;
  scanner.walk(ast);
  return scanner.has;
}